

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::PrintTokens(FParser *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < this->NumTokens; lVar1 = lVar1 + 1) {
    Printf("\n\'%s\' \t\t --",this->Tokens[lVar1]);
    if ((ulong)this->TokenType[lVar1] < 6) {
      Printf(&DAT_005eec24 + *(int *)(&DAT_005eec24 + (ulong)this->TokenType[lVar1] * 4));
    }
  }
  Printf("\n");
  if (this->Section != (DFsSection *)0x0) {
    Printf("current section: offset %i\n",(ulong)(uint)this->Section->start_index);
    return;
  }
  return;
}

Assistant:

void FParser::PrintTokens()	// DEBUG
{
	int i;
	for (i = 0; i < NumTokens; i++)
	{
		Printf("\n'%s' \t\t --", Tokens[i]);
		switch (TokenType[i])
		{
		case string_:
			Printf("string");
			break;
		case operator_:
			Printf("operator");
			break;
		case name_:
			Printf("name");
			break;
		case number:
			Printf("number");
			break;
		case unset:
			Printf("duh");
			break;
		case function:
			Printf("function name");
			break;
		}
	}
	Printf("\n");
	if (Section)
		Printf("current section: offset %i\n", Section->start_index);
}